

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

bool Potassco::parseUnsigned(char **x,unsigned_long_long *out,unsigned_long_long uMax)

{
  char *pcVar1;
  int iVar2;
  ulonglong uVar3;
  int *piVar4;
  ulong in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  unsigned_long_long temp;
  char *err;
  size_t len;
  ulong local_40;
  char *local_30;
  size_t local_28;
  ulong local_20;
  ulong *local_18;
  long *local_10;
  bool local_1;
  
  if (((*in_RDI == 0) || (*(char *)*in_RDI == '\0')) ||
     ((*(char *)*in_RDI == '-' && (*(char *)(*in_RDI + 1) != '1')))) {
    local_1 = false;
  }
  else {
    local_28 = 4;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar2 = strncmp((char *)*in_RDI,"imax",4);
    if ((iVar2 != 0) && (iVar2 = strncmp((char *)*local_10,"umax",local_28), iVar2 != 0)) {
      local_28 = 2;
      iVar2 = strncmp((char *)*local_10,"-1",2);
      if (iVar2 != 0) {
        pcVar1 = (char *)*local_10;
        iVar2 = detectBase((char *)*local_10);
        uVar3 = strtoull(pcVar1,&local_30,iVar2);
        *local_18 = uVar3;
        if ((*local_18 == 0xffffffffffffffff) && (piVar4 = __errno_location(), *piVar4 == 0x22)) {
          piVar4 = __errno_location();
          *piVar4 = 0;
          pcVar1 = (char *)*local_10;
          iVar2 = detectBase((char *)*local_10);
          uVar3 = strtoull(pcVar1,(char **)0x0,iVar2);
          piVar4 = __errno_location();
          if ((*piVar4 == 0x22) || (*local_18 != uVar3)) {
            return false;
          }
        }
        if ((local_30 != (char *)*local_10) && (*local_18 <= local_20)) {
          *local_10 = (long)local_30;
          return true;
        }
        return false;
      }
    }
    if (*(char *)*local_10 == 'i') {
      local_40 = local_20 >> 1;
    }
    else {
      local_40 = local_20;
    }
    *local_18 = local_40;
    *local_10 = local_28 + *local_10;
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool parseUnsigned(const char*& x, unsigned long long& out, unsigned long long uMax) {
	if (!x || !*x || (*x == '-' && x[1] != '1')) {
		return false;
	}
	std::size_t len = 4;
	if (std::strncmp(x, "imax", len) == 0 || std::strncmp(x, "umax", len) == 0 || std::strncmp(x, "-1", len=2) == 0) {
		out = *x != 'i' ? uMax : uMax >> 1;
		x  += len;
		return true;
	}
	char* err;
	out = strtoull(x, &err, detectBase(x));
	if (out == ULLONG_MAX && errno == ERANGE) {
		errno = 0;
		unsigned long long temp = strtoull(x, 0, detectBase(x));
		if (errno == ERANGE || out != temp) {
			return false;
		}
	}
	if (err == x || out > uMax) {
		return false;
	}
	x = err;
	return true;
}